

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleMenuBar::child(QAccessibleMenuBar *this,int index)

{
  int iVar1;
  QWidget *menu;
  QWidget *this_00;
  QAccessibleInterface *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))();
  if (index < iVar1) {
    menu = &menuBar(this)->super_QWidget;
    this_00 = &menuBar(this)->super_QWidget;
    QWidget::actions((QList<QAction_*> *)&QStack_38,this_00);
    pQVar2 = getOrCreateMenu(menu,QStack_38.ptr[index]);
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&QStack_38);
  }
  else {
    pQVar2 = (QAccessibleInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMenuBar::child(int index) const
{
    if (index < childCount()) {
        return getOrCreateMenu(menuBar(), menuBar()->actions().at(index));
    }
    return nullptr;
}